

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_decoder.c
# Opt level: O1

lzma_ret decode_buffer(lzma_coder *coder,uint8_t *in,size_t *in_pos,size_t in_size,uint8_t *out,
                      size_t *out_pos,size_t out_size)

{
  size_t *psVar1;
  size_t sVar2;
  ulong uVar3;
  void *pvVar4;
  bool bVar5;
  lzma_ret lVar6;
  ulong uVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  ulong uVar10;
  ulong __n;
  size_t sVar11;
  
  psVar1 = &(coder->dict).pos;
  sVar11 = *out_pos;
  puVar8 = in;
  do {
    sVar2 = (coder->dict).size;
    if ((coder->dict).pos == sVar2) {
      *psVar1 = 0;
    }
    uVar3 = (coder->dict).pos;
    pvVar4 = (coder->lz).coder;
    uVar10 = out_size - sVar11;
    uVar7 = sVar2 - uVar3;
    if (uVar10 < uVar7) {
      uVar7 = uVar10;
    }
    (coder->dict).limit = uVar7 + uVar3;
    lVar6 = (*(coder->lz).code)(pvVar4,&coder->dict,in,in_pos,in_size);
    uVar7 = (coder->dict).pos;
    __n = uVar7 - uVar3;
    if (uVar10 < __n) {
      __assert_fail("copy_size <= out_size - *out_pos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_decoder.c"
                    ,99,
                    "lzma_ret decode_buffer(lzma_coder *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t)"
                   );
    }
    if (uVar7 != uVar3) {
      memcpy(out + sVar11,(coder->dict).buf + uVar3,__n);
    }
    puVar9 = (uint8_t *)(ulong)lVar6;
    sVar11 = __n + sVar11;
    *out_pos = sVar11;
    if ((coder->dict).need_reset == true) {
      *psVar1 = 0;
      (coder->dict).full = 0;
      bVar5 = false;
      (coder->dict).buf[(coder->dict).size - 1] = '\0';
      (coder->dict).need_reset = false;
      if ((lVar6 == LZMA_OK) && (sVar11 != out_size)) {
LAB_001a3b91:
        bVar5 = true;
        puVar9 = (uint8_t *)((ulong)puVar8 & 0xffffffff);
      }
    }
    else {
      bVar5 = false;
      if ((lVar6 == LZMA_OK) && (sVar11 != out_size)) {
        if ((coder->dict).size <= uVar7) goto LAB_001a3b91;
        bVar5 = false;
      }
    }
    puVar8 = puVar9;
    if (!bVar5) {
      return (lzma_ret)puVar9;
    }
  } while( true );
}

Assistant:

static lzma_ret
decode_buffer(lzma_coder *coder,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size)
{
	while (true) {
		// Wrap the dictionary if needed.
		if (coder->dict.pos == coder->dict.size)
			coder->dict.pos = 0;

		// Store the current dictionary position. It is needed to know
		// where to start copying to the out[] buffer.
		const size_t dict_start = coder->dict.pos;

		// Calculate how much we allow coder->lz.code() to decode.
		// It must not decode past the end of the dictionary
		// buffer, and we don't want it to decode more than is
		// actually needed to fill the out[] buffer.
		coder->dict.limit = coder->dict.pos
				+ my_min(out_size - *out_pos,
					coder->dict.size - coder->dict.pos);

		// Call the coder->lz.code() to do the actual decoding.
		const lzma_ret ret = coder->lz.code(
				coder->lz.coder, &coder->dict,
				in, in_pos, in_size);

		// Copy the decoded data from the dictionary to the out[]
		// buffer. Do it conditionally because out can be NULL
		// (in which case copy_size is always 0). Calling memcpy()
		// with a null-pointer is undefined even if the third
		// argument is 0.
		const size_t copy_size = coder->dict.pos - dict_start;
		assert(copy_size <= out_size - *out_pos);

		if (copy_size > 0)
			memcpy(out + *out_pos, coder->dict.buf + dict_start,
					copy_size);

		*out_pos += copy_size;

		// Reset the dictionary if so requested by coder->lz.code().
		if (coder->dict.need_reset) {
			lz_decoder_reset(coder);

			// Since we reset dictionary, we don't check if
			// dictionary became full.
			if (ret != LZMA_OK || *out_pos == out_size)
				return ret;
		} else {
			// Return if everything got decoded or an error
			// occurred, or if there's no more data to decode.
			//
			// Note that detecting if there's something to decode
			// is done by looking if dictionary become full
			// instead of looking if *in_pos == in_size. This
			// is because it is possible that all the input was
			// consumed already but some data is pending to be
			// written to the dictionary.
			if (ret != LZMA_OK || *out_pos == out_size
					|| coder->dict.pos < coder->dict.size)
				return ret;
		}
	}
}